

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hiredis.c
# Opt level: O1

int redisvFormatCommand(char **target,char *format,__va_list_tag *ap)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  sds pcVar4;
  sds pcVar5;
  undefined8 *puVar6;
  void *pvVar7;
  ushort **ppuVar8;
  char *pcVar9;
  void *pvVar10;
  size_t *psVar11;
  size_t sVar12;
  char *pcVar13;
  int iVar14;
  ulong uVar15;
  size_t __n;
  long lVar16;
  __va_list_tag *p_Var17;
  uint uVar18;
  int iVar19;
  ulong uVar20;
  int iVar21;
  bool bVar22;
  char _format [16];
  va_list _cpy;
  uint local_80;
  int local_7c;
  void *local_70;
  char local_58;
  char acStack_57 [15];
  __va_list_tag local_48;
  
  if (target == (char **)0x0) {
    return -1;
  }
  pcVar4 = sdsempty();
  if (pcVar4 == (sds)0x0) {
    return -1;
  }
  iVar3 = 0;
  local_70 = (void *)0x0;
  local_80 = 0;
  iVar21 = 0;
  iVar19 = -1;
LAB_00104fb2:
  cVar2 = *format;
  pvVar10 = local_70;
  if (cVar2 != ' ') {
    if (cVar2 == '%') {
      bVar1 = format[1];
      pcVar5 = pcVar4;
      if (bVar1 < 0x62) {
        if (bVar1 == 0) goto LAB_00104fcd;
        if (bVar1 == 0x25) {
          pcVar5 = sdscat(pcVar4,"%");
          goto LAB_001053cd;
        }
LAB_0010504f:
        pcVar13 = format + 1;
        cVar2 = *pcVar13;
        while ((cVar2 != '\0' && (pvVar7 = memchr("#0-+ ",(int)cVar2,6), pvVar7 != (void *)0x0))) {
          cVar2 = pcVar13[1];
          pcVar13 = pcVar13 + 1;
        }
        cVar2 = *pcVar13;
        if (cVar2 != '\0') {
          ppuVar8 = __ctype_b_loc();
          pcVar9 = pcVar13;
          do {
            pcVar9 = pcVar9 + 1;
            if ((*(byte *)((long)*ppuVar8 + (long)cVar2 * 2 + 1) & 8) == 0) {
              if (cVar2 == '.') goto LAB_00105215;
              break;
            }
            cVar2 = pcVar13[1];
            pcVar13 = pcVar13 + 1;
          } while (cVar2 != '\0');
        }
        goto LAB_00105234;
      }
      if (bVar1 == 0x62) {
        uVar18 = ap->gp_offset;
        if ((ulong)uVar18 < 0x29) {
          puVar6 = (undefined8 *)((ulong)uVar18 + (long)ap->reg_save_area);
          ap->gp_offset = uVar18 + 8;
        }
        else {
          puVar6 = (undefined8 *)ap->overflow_arg_area;
          ap->overflow_arg_area = puVar6 + 1;
        }
        pcVar13 = (char *)*puVar6;
        uVar18 = ap->gp_offset;
        if ((ulong)uVar18 < 0x29) {
          psVar11 = (size_t *)((ulong)uVar18 + (long)ap->reg_save_area);
          ap->gp_offset = uVar18 + 8;
        }
        else {
          psVar11 = (size_t *)ap->overflow_arg_area;
          ap->overflow_arg_area = psVar11 + 1;
        }
        sVar12 = *psVar11;
      }
      else {
        if (bVar1 != 0x73) goto LAB_0010504f;
        uVar18 = ap->gp_offset;
        if ((ulong)uVar18 < 0x29) {
          puVar6 = (undefined8 *)((ulong)uVar18 + (long)ap->reg_save_area);
          ap->gp_offset = uVar18 + 8;
        }
        else {
          puVar6 = (undefined8 *)ap->overflow_arg_area;
          ap->overflow_arg_area = puVar6 + 1;
        }
        pcVar13 = (char *)*puVar6;
        sVar12 = strlen(pcVar13);
      }
      if (sVar12 != 0) {
        pcVar5 = sdscatlen(pcVar4,pcVar13,sVar12);
      }
      goto LAB_001053cd;
    }
    if (cVar2 != '\0') {
LAB_00104fcd:
      pcVar5 = sdscatlen(pcVar4,format,1);
      if (pcVar5 != (sds)0x0) {
        pcVar4 = pcVar5;
        iVar3 = 1;
        goto LAB_001053f1;
      }
      goto LAB_00105441;
    }
    if (iVar3 == 0) {
      sdsfree(pcVar4);
    }
    else {
      local_70 = realloc(local_70,(long)(int)local_80 * 8 + 8);
      if (local_70 == (void *)0x0) {
        local_7c = -1;
        goto LAB_001056f4;
      }
      *(sds *)((long)local_70 + (long)(int)local_80 * 8) = pcVar4;
      switch(pcVar4[-1] & 7) {
      case 0:
        sVar12 = (size_t)((byte)pcVar4[-1] >> 3);
        break;
      case 1:
        sVar12 = (size_t)(byte)pcVar4[-3];
        break;
      case 2:
        sVar12 = (size_t)*(ushort *)(pcVar4 + -5);
        break;
      case 3:
        sVar12 = (size_t)*(uint *)(pcVar4 + -9);
        break;
      case 4:
        sVar12 = *(size_t *)(pcVar4 + -0x11);
        break;
      default:
        sVar12 = 0;
      }
      local_80 = local_80 + 1;
      sVar12 = bulklen(sVar12);
      iVar21 = iVar21 + (int)sVar12;
    }
    iVar19 = 1;
    if (local_80 < 10) goto LAB_0010555c;
    uVar20 = (long)(int)local_80;
    iVar3 = 4;
    goto LAB_0010551b;
  }
  bVar22 = iVar3 != 0;
  iVar3 = 0;
  if (bVar22) {
    pvVar10 = realloc(local_70,(long)(int)local_80 * 8 + 8);
    local_7c = -1;
    if (pvVar10 == (void *)0x0) goto LAB_00105441;
    *(sds *)((long)pvVar10 + (long)(int)local_80 * 8) = pcVar4;
    switch(pcVar4[-1] & 7) {
    case 0:
      sVar12 = (size_t)((byte)pcVar4[-1] >> 3);
      break;
    case 1:
      sVar12 = (size_t)(byte)pcVar4[-3];
      break;
    case 2:
      sVar12 = (size_t)*(ushort *)(pcVar4 + -5);
      break;
    case 3:
      sVar12 = (size_t)*(uint *)(pcVar4 + -9);
      break;
    case 4:
      sVar12 = *(size_t *)(pcVar4 + -0x11);
      break;
    default:
      sVar12 = 0;
    }
    local_80 = local_80 + 1;
    sVar12 = bulklen(sVar12);
    pcVar4 = sdsempty();
    if (pcVar4 != (sds)0x0) {
      iVar21 = iVar21 + (int)sVar12;
      local_70 = pvVar10;
      goto LAB_001053f1;
    }
    pcVar4 = (sds)0x0;
    goto LAB_001056f4;
  }
  goto LAB_001053f1;
  while( true ) {
    ppuVar8 = __ctype_b_loc();
    pcVar9 = pcVar13 + 1;
    if ((*(byte *)((long)*ppuVar8 + (long)cVar2 * 2 + 1) & 8) == 0) break;
LAB_00105215:
    pcVar13 = pcVar9;
    cVar2 = *pcVar13;
    if ((long)cVar2 == 0) break;
  }
LAB_00105234:
  local_48.reg_save_area = ap->reg_save_area;
  local_48.gp_offset = ap->gp_offset;
  local_48.fp_offset = ap->fp_offset;
  local_48.overflow_arg_area = ap->overflow_arg_area;
  cVar2 = *pcVar13;
  pvVar7 = memchr("diouxX",(int)cVar2,7);
  if (pvVar7 == (void *)0x0) {
    pvVar7 = memchr("eEfFgGaA",(int)cVar2,9);
    if (pvVar7 != (void *)0x0) {
      if (ap->fp_offset < 0xa1) {
        ap->fp_offset = ap->fp_offset + 0x10;
      }
      else {
        ap->overflow_arg_area = (void *)((long)ap->overflow_arg_area + 8);
      }
      goto LAB_001052f3;
    }
    iVar14 = 0xe;
    p_Var17 = ap;
    if (cVar2 == 'l') {
      if (pcVar13[1] != 'l') goto LAB_0010537f;
LAB_0010534c:
      if (pcVar13[2] == '\0') goto LAB_001053bf;
      pvVar7 = memchr("diouxX",(int)pcVar13[2],7);
      if (pvVar7 != (void *)0x0) {
        pcVar13 = pcVar13 + 2;
        goto LAB_001053a9;
      }
LAB_001053ff:
      bVar22 = false;
      iVar14 = 0xe;
    }
    else if (cVar2 == 'h') {
      if (pcVar13[1] == 'h') goto LAB_0010534c;
LAB_0010537f:
      if (pcVar13[1] != '\0') {
        pvVar7 = memchr("diouxX",(int)pcVar13[1],7);
        if (pvVar7 != (void *)0x0) {
          pcVar13 = pcVar13 + 1;
LAB_001053a9:
          if (ap->gp_offset < 0x29) {
            ap->gp_offset = ap->gp_offset + 8;
          }
          else {
            ap->overflow_arg_area = (void *)((long)ap->overflow_arg_area + 8);
          }
          goto LAB_001052f3;
        }
        goto LAB_001053ff;
      }
      bVar22 = false;
    }
    else {
LAB_001053bf:
      bVar22 = false;
    }
  }
  else {
    if (ap->gp_offset < 0x29) {
      ap->gp_offset = ap->gp_offset + 8;
    }
    else {
      ap->overflow_arg_area = (void *)((long)ap->overflow_arg_area + 8);
    }
LAB_001052f3:
    p_Var17 = (__va_list_tag *)(pcVar13 + (1 - (long)format));
    iVar14 = 5;
    bVar22 = true;
    if (p_Var17 < (__va_list_tag *)0xe) {
      memcpy(&local_58,format,(size_t)p_Var17);
      (&local_58)[(long)p_Var17] = '\0';
      pcVar5 = sdscatvprintf(pcVar4,&local_58,&local_48);
      bVar22 = true;
      iVar14 = 5;
      format = pcVar13 + -1;
    }
  }
  iVar19 = (int)p_Var17;
  if (bVar22) {
LAB_001053cd:
    if (pcVar5 == (sds)0x0) {
      iVar14 = 4;
    }
    else {
      format = format + 1;
      iVar14 = 0;
      iVar3 = 1;
      pcVar4 = pcVar5;
    }
  }
  if (iVar14 != 0) goto LAB_00105419;
LAB_001053f1:
  format = format + 1;
  iVar19 = iVar3;
  goto LAB_00104fb2;
LAB_00105419:
  if (iVar14 == 4) {
LAB_00105441:
    local_7c = -1;
    pvVar10 = local_70;
  }
  else {
    local_7c = -2;
    if (iVar14 != 0xe) {
      return iVar19;
    }
  }
  goto LAB_001056f4;
  while( true ) {
    if (uVar20 < 10000) goto LAB_0010555c;
    bVar22 = uVar20 < 100000;
    uVar20 = uVar20 / 10000;
    iVar3 = iVar19 + 4;
    if (bVar22) break;
LAB_0010551b:
    iVar19 = iVar3;
    if (uVar20 < 100) {
      iVar19 = iVar19 + -2;
      goto LAB_0010555c;
    }
    if (uVar20 < 1000) {
      iVar19 = iVar19 + -1;
      goto LAB_0010555c;
    }
  }
  iVar19 = iVar19 + 1;
LAB_0010555c:
  pcVar13 = (char *)malloc((long)(iVar21 + iVar19 + 4));
  if (pcVar13 != (char *)0x0) {
    iVar21 = iVar21 + iVar19 + 3;
    iVar19 = sprintf(pcVar13,"*%d\r\n",(ulong)local_80);
    if (0 < (int)local_80) {
      uVar20 = 0;
      do {
        lVar16 = *(long *)((long)local_70 + uVar20 * 8);
        switch(*(byte *)(lVar16 + -1) & 7) {
        case 0:
          uVar15 = (ulong)(*(byte *)(lVar16 + -1) >> 3);
          break;
        case 1:
          uVar15 = (ulong)*(byte *)(lVar16 + -3);
          break;
        case 2:
          uVar15 = (ulong)*(ushort *)(lVar16 + -5);
          break;
        case 3:
          uVar15 = (ulong)*(uint *)(lVar16 + -9);
          break;
        case 4:
          uVar15 = *(ulong *)(lVar16 + -0x11);
          break;
        default:
          uVar15 = 0;
        }
        iVar3 = sprintf(pcVar13 + iVar19,"$%zu\r\n",uVar15);
        pvVar10 = *(void **)((long)local_70 + uVar20 * 8);
        switch(*(byte *)((long)pvVar10 + -1) & 7) {
        case 0:
          __n = (size_t)(*(byte *)((long)pvVar10 + -1) >> 3);
          break;
        case 1:
          __n = (size_t)*(byte *)((long)pvVar10 + -3);
          break;
        case 2:
          __n = (size_t)*(ushort *)((long)pvVar10 + -5);
          break;
        case 3:
          __n = (size_t)*(uint *)((long)pvVar10 + -9);
          break;
        case 4:
          __n = *(size_t *)((long)pvVar10 + -0x11);
          break;
        default:
          __n = 0;
        }
        iVar3 = iVar3 + iVar19;
        memcpy(pcVar13 + iVar3,pvVar10,__n);
        pcVar4 = *(sds *)((long)local_70 + uVar20 * 8);
        switch(pcVar4[-1] & 7) {
        case 0:
          uVar18 = (uint)((byte)pcVar4[-1] >> 3);
          break;
        case 1:
          uVar18 = (uint)(byte)pcVar4[-3];
          break;
        case 2:
          uVar18 = (uint)*(ushort *)(pcVar4 + -5);
          break;
        case 3:
          uVar18 = *(uint *)(pcVar4 + -9);
          break;
        case 4:
          uVar18 = (uint)*(undefined8 *)(pcVar4 + -0x11);
          break;
        default:
          uVar18 = 0;
        }
        sdsfree(pcVar4);
        (pcVar13 + (int)(uVar18 + iVar3))[0] = '\r';
        (pcVar13 + (int)(uVar18 + iVar3))[1] = '\n';
        iVar19 = uVar18 + iVar3 + 2;
        uVar20 = uVar20 + 1;
      } while (local_80 != uVar20);
    }
    if (iVar19 == iVar21) {
      pcVar13[iVar19] = '\0';
      free(local_70);
      *target = pcVar13;
      return iVar21;
    }
    __assert_fail("pos == totlen",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/hiredis.c"
                  ,0x1e5,"int redisvFormatCommand(char **, const char *, struct __va_list_tag *)");
  }
  local_7c = -1;
  pcVar4 = (sds)0x0;
  pvVar10 = local_70;
LAB_001056f4:
  if (pvVar10 != (void *)0x0) {
    if (local_80 != 0) {
      lVar16 = (long)(int)local_80;
      do {
        sdsfree(*(sds *)((long)pvVar10 + lVar16 * 8 + -8));
        lVar16 = lVar16 + -1;
      } while (lVar16 != 0);
    }
    free(pvVar10);
  }
  sdsfree(pcVar4);
  return local_7c;
}

Assistant:

int redisvFormatCommand(char **target, const char *format, va_list ap) {
    const char *c = format;
    char *cmd = NULL; /* final command */
    int pos; /* position in final command */
    sds curarg, newarg; /* current argument */
    int touched = 0; /* was the current argument touched? */
    char **curargv = NULL, **newargv = NULL;
    int argc = 0;
    int totlen = 0;
    int error_type = 0; /* 0 = no error; -1 = memory error; -2 = format error */
    int j;

    /* Abort if there is not target to set */
    if (target == NULL)
        return -1;

    /* Build the command string accordingly to protocol */
    curarg = sdsempty();
    if (curarg == NULL)
        return -1;

    while(*c != '\0') {
        if (*c != '%' || c[1] == '\0') {
            if (*c == ' ') {
                if (touched) {
                    newargv = realloc(curargv,sizeof(char*)*(argc+1));
                    if (newargv == NULL) goto memory_err;
                    curargv = newargv;
                    curargv[argc++] = curarg;
                    totlen += bulklen(sdslen(curarg));

                    /* curarg is put in argv so it can be overwritten. */
                    curarg = sdsempty();
                    if (curarg == NULL) goto memory_err;
                    touched = 0;
                }
            } else {
                newarg = sdscatlen(curarg,c,1);
                if (newarg == NULL) goto memory_err;
                curarg = newarg;
                touched = 1;
            }
        } else {
            char *arg;
            size_t size;

            /* Set newarg so it can be checked even if it is not touched. */
            newarg = curarg;

            switch(c[1]) {
            case 's':
                arg = va_arg(ap,char*);
                size = strlen(arg);
                if (size > 0)
                    newarg = sdscatlen(curarg,arg,size);
                break;
            case 'b':
                arg = va_arg(ap,char*);
                size = va_arg(ap,size_t);
                if (size > 0)
                    newarg = sdscatlen(curarg,arg,size);
                break;
            case '%':
                newarg = sdscat(curarg,"%");
                break;
            default:
                /* Try to detect printf format */
                {
                    static const char intfmts[] = "diouxX";
                    static const char flags[] = "#0-+ ";
                    char _format[16];
                    const char *_p = c+1;
                    size_t _l = 0;
                    va_list _cpy;

                    /* Flags */
                    while (*_p != '\0' && strchr(flags,*_p) != NULL) _p++;

                    /* Field width */
                    while (*_p != '\0' && isdigit(*_p)) _p++;

                    /* Precision */
                    if (*_p == '.') {
                        _p++;
                        while (*_p != '\0' && isdigit(*_p)) _p++;
                    }

                    /* Copy va_list before consuming with va_arg */
                    va_copy(_cpy,ap);

                    /* Integer conversion (without modifiers) */
                    if (strchr(intfmts,*_p) != NULL) {
                        va_arg(ap,int);
                        goto fmt_valid;
                    }

                    /* Double conversion (without modifiers) */
                    if (strchr("eEfFgGaA",*_p) != NULL) {
                        va_arg(ap,double);
                        goto fmt_valid;
                    }

                    /* Size: char */
                    if (_p[0] == 'h' && _p[1] == 'h') {
                        _p += 2;
                        if (*_p != '\0' && strchr(intfmts,*_p) != NULL) {
                            va_arg(ap,int); /* char gets promoted to int */
                            goto fmt_valid;
                        }
                        goto fmt_invalid;
                    }

                    /* Size: short */
                    if (_p[0] == 'h') {
                        _p += 1;
                        if (*_p != '\0' && strchr(intfmts,*_p) != NULL) {
                            va_arg(ap,int); /* short gets promoted to int */
                            goto fmt_valid;
                        }
                        goto fmt_invalid;
                    }

                    /* Size: long long */
                    if (_p[0] == 'l' && _p[1] == 'l') {
                        _p += 2;
                        if (*_p != '\0' && strchr(intfmts,*_p) != NULL) {
                            va_arg(ap,long long);
                            goto fmt_valid;
                        }
                        goto fmt_invalid;
                    }

                    /* Size: long */
                    if (_p[0] == 'l') {
                        _p += 1;
                        if (*_p != '\0' && strchr(intfmts,*_p) != NULL) {
                            va_arg(ap,long);
                            goto fmt_valid;
                        }
                        goto fmt_invalid;
                    }

                fmt_invalid:
                    va_end(_cpy);
                    goto format_err;

                fmt_valid:
                    _l = (_p+1)-c;
                    if (_l < sizeof(_format)-2) {
                        memcpy(_format,c,_l);
                        _format[_l] = '\0';
                        newarg = sdscatvprintf(curarg,_format,_cpy);

                        /* Update current position (note: outer blocks
                         * increment c twice so compensate here) */
                        c = _p-1;
                    }

                    va_end(_cpy);
                    break;
                }
            }

            if (newarg == NULL) goto memory_err;
            curarg = newarg;

            touched = 1;
            c++;
        }
        c++;
    }

    /* Add the last argument if needed */
    if (touched) {
        newargv = realloc(curargv,sizeof(char*)*(argc+1));
        if (newargv == NULL) goto memory_err;
        curargv = newargv;
        curargv[argc++] = curarg;
        totlen += bulklen(sdslen(curarg));
    } else {
        sdsfree(curarg);
    }

    /* Clear curarg because it was put in curargv or was free'd. */
    curarg = NULL;

    /* Add bytes needed to hold multi bulk count */
    totlen += 1+countDigits(argc)+2;

    /* Build the command at protocol level */
    cmd = malloc(totlen+1);
    if (cmd == NULL) goto memory_err;

    pos = sprintf(cmd,"*%d\r\n",argc);
    for (j = 0; j < argc; j++) {
        pos += sprintf(cmd+pos,"$%zu\r\n",sdslen(curargv[j]));
        memcpy(cmd+pos,curargv[j],sdslen(curargv[j]));
        pos += sdslen(curargv[j]);
        sdsfree(curargv[j]);
        cmd[pos++] = '\r';
        cmd[pos++] = '\n';
    }
    assert(pos == totlen);
    cmd[pos] = '\0';

    free(curargv);
    *target = cmd;
    return totlen;

format_err:
    error_type = -2;
    goto cleanup;

memory_err:
    error_type = -1;
    goto cleanup;

cleanup:
    if (curargv) {
        while(argc--)
            sdsfree(curargv[argc]);
        free(curargv);
    }

    sdsfree(curarg);
    free(cmd);

    return error_type;
}